

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int DataTypeFormatString(char *buf,int buf_size,ImGuiDataType data_type,void *data_ptr,char *format)

{
  float *in_RCX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  char *in_R8;
  undefined4 local_4;
  
  if ((in_EDX == 0) || (in_EDX == 1)) {
    local_4 = ImFormatString(in_RDI,(long)in_ESI,in_R8,(ulong)(uint)*in_RCX);
  }
  else if ((in_EDX == 2) || (in_EDX == 3)) {
    local_4 = ImFormatString(in_RDI,(long)in_ESI,in_R8,*(undefined8 *)in_RCX);
  }
  else if (in_EDX == 4) {
    local_4 = ImFormatString((char *)(double)*in_RCX,(size_t)in_RDI,(char *)(long)in_ESI,in_R8);
  }
  else if (in_EDX == 5) {
    local_4 = ImFormatString(*(char **)in_RCX,(size_t)in_RDI,(char *)(long)in_ESI,in_R8);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int DataTypeFormatString(char* buf, int buf_size, ImGuiDataType data_type, const void* data_ptr, const char* format)
{
    if (data_type == ImGuiDataType_S32 || data_type == ImGuiDataType_U32)   // Signedness doesn't matter when pushing the argument
        return ImFormatString(buf, buf_size, format, *(const ImU32*)data_ptr);
    if (data_type == ImGuiDataType_S64 || data_type == ImGuiDataType_U64)   // Signedness doesn't matter when pushing the argument
        return ImFormatString(buf, buf_size, format, *(const ImU64*)data_ptr);
    if (data_type == ImGuiDataType_Float)
        return ImFormatString(buf, buf_size, format, *(const float*)data_ptr);
    if (data_type == ImGuiDataType_Double)
        return ImFormatString(buf, buf_size, format, *(const double*)data_ptr);
    IM_ASSERT(0);
    return 0;
}